

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFont.cpp
# Opt level: O2

void __thiscall
irr::gui::CGUIFont::draw
          (CGUIFont *this,stringw *text,rect<int> *position,SColor color,bool hcenter,bool vcenter,
          rect<int> *clip)

{
  wchar_t c;
  vector2d<int> vVar1;
  pointer pwVar2;
  pointer pSVar3;
  int iVar4;
  uint uVar5;
  s32 sVar6;
  stringw *psVar7;
  u32 i;
  uint uVar8;
  vector2d<int> offset;
  array<unsigned_int> indices;
  array<irr::core::vector2d<int>_> offsets;
  vector2d<int> local_98;
  undefined8 local_90;
  stringw *local_88;
  u32 local_7c;
  stringw *local_78;
  array<unsigned_int> local_70;
  array<irr::core::vector2d<int>_> local_50;
  
  if ((this->Driver != (IVideoDriver *)0x0) && (this->SpriteBank != (IGUISpriteBank *)0x0)) {
    vVar1 = position->UpperLeftCorner;
    local_90 = 0;
    iVar4 = 0;
    local_98 = vVar1;
    local_88 = text;
    local_7c = color.color;
    if ((vcenter || hcenter) || clip != (rect<int> *)0x0) {
      local_90 = (**(code **)(*(long *)this + 8))(this,(text->str)._M_dataplus._M_p);
      iVar4 = (int)((ulong)local_90 >> 0x20);
    }
    if (hcenter) {
      local_98.X = ((position->LowerRightCorner).X - ((position->UpperLeftCorner).X + (int)local_90)
                   >> 1) + vVar1.X;
    }
    if (vcenter) {
      local_98.Y = ((position->LowerRightCorner).Y - ((position->UpperLeftCorner).Y + iVar4) >> 1) +
                   vVar1.Y;
    }
    if (clip != (rect<int> *)0x0) {
      local_70.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_98;
      local_70.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = (int)local_90 + local_98.X;
      local_70.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = iVar4 + local_98.Y;
      core::rect<int>::clipAgainst((rect<int> *)&local_70,clip);
      if ((int)local_70.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish <
          (int)local_70.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start) {
        return;
      }
      if (local_70.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ <
          local_70.m_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_) {
        return;
      }
    }
    psVar7 = local_88;
    core::array<unsigned_int>::array(&local_70,(u32)(local_88->str)._M_string_length);
    core::array<irr::core::vector2d<int>_>::array(&local_50,(u32)(psVar7->str)._M_string_length);
    local_78 = &this->Invisible;
    for (uVar8 = 0; uVar8 < (uint)(psVar7->str)._M_string_length; uVar8 = uVar8 + 1) {
      pwVar2 = (psVar7->str)._M_dataplus._M_p;
      c = pwVar2[uVar8];
      if (c == L'\n') {
LAB_00230dde:
        local_98.Y = local_98.Y + this->MaxHeight;
        local_98.X = (position->UpperLeftCorner).X;
        if (hcenter) {
          local_98.X = ((position->LowerRightCorner).X - ((int)local_90 + local_98.X) >> 1) +
                       local_98.X;
        }
      }
      else {
        if (c == L'\r') {
          if (pwVar2[(ulong)uVar8 + 1] == L'\n') {
            uVar8 = uVar8 + 1;
          }
          goto LAB_00230dde;
        }
        uVar5 = getAreaFromCharacter(this,c);
        pSVar3 = (this->Areas).m_data.
                 super__Vector_base<irr::gui::CGUIFont::SFontArea,_std::allocator<irr::gui::CGUIFont::SFontArea>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_98.X = local_98.X + pSVar3[uVar5].underhang;
        sVar6 = core::string<wchar_t>::findFirst(local_78,c);
        if (sVar6 < 0) {
          core::array<unsigned_int>::push_back(&local_70,&pSVar3[uVar5].spriteno);
          core::array<irr::core::vector2d<int>_>::push_back(&local_50,&local_98);
        }
        local_98.X = local_98.X +
                     pSVar3[uVar5].overhang + pSVar3[uVar5].width + this->GlobalKerningWidth;
        psVar7 = local_88;
      }
    }
    (*this->SpriteBank->_vptr_IGUISpriteBank[10])
              (this->SpriteBank,&local_70,&local_50,clip,&local_7c,0,0,1,0);
    ::std::_Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>::
    ~_Vector_base((_Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                   *)&local_50);
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
  }
  return;
}

Assistant:

void CGUIFont::draw(const core::stringw &text, const core::rect<s32> &position,
		video::SColor color,
		bool hcenter, bool vcenter, const core::rect<s32> *clip)
{
	if (!Driver || !SpriteBank)
		return;

	core::dimension2d<s32> textDimension; // NOTE: don't make this u32 or the >> later on can fail when the dimension width is < position width
	core::position2d<s32> offset = position.UpperLeftCorner;

	if (hcenter || vcenter || clip)
		textDimension = getDimension(text.c_str());

	if (hcenter)
		offset.X += (position.getWidth() - textDimension.Width) >> 1;

	if (vcenter)
		offset.Y += (position.getHeight() - textDimension.Height) >> 1;

	if (clip) {
		core::rect<s32> clippedRect(offset, textDimension);
		clippedRect.clipAgainst(*clip);
		if (!clippedRect.isValid())
			return;
	}

	core::array<u32> indices(text.size());
	core::array<core::position2di> offsets(text.size());

	for (u32 i = 0; i < text.size(); i++) {
		wchar_t c = text[i];

		bool lineBreak = false;
		if (c == L'\r') { // Mac or Windows breaks
			lineBreak = true;
			if (text[i + 1] == L'\n') // Windows breaks
				c = text[++i];
		} else if (c == L'\n') { // Unix breaks
			lineBreak = true;
		}

		if (lineBreak) {
			offset.Y += MaxHeight;
			offset.X = position.UpperLeftCorner.X;

			if (hcenter) {
				offset.X += (position.getWidth() - textDimension.Width) >> 1;
			}
			continue;
		}

		SFontArea &area = Areas[getAreaFromCharacter(c)];

		offset.X += area.underhang;
		if (Invisible.findFirst(c) < 0) {
			indices.push_back(area.spriteno);
			offsets.push_back(offset);
		}

		offset.X += area.width + area.overhang + GlobalKerningWidth;
	}

	SpriteBank->draw2DSpriteBatch(indices, offsets, clip, color);
}